

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv_async_init(uv_loop_t *loop,uv_async_t *handle,uv_async_cb async_cb)

{
  int iVar1;
  undefined8 in_RDX;
  uv__async_cb in_RSI;
  uv__async *in_RDI;
  int err;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = uv__async_start((uv_loop_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,in_RDI,in_RSI);
  if (iVar1 == 0) {
    *(uv__async **)(in_RSI + 0x10) = in_RDI;
    *(undefined4 *)(in_RSI + 0x18) = 1;
    *(undefined4 *)(in_RSI + 0x30) = 0x2000;
    *(void ***)(in_RSI + 0x20) = (in_RDI->io_watcher).pending_queue;
    *(void **)(in_RSI + 0x28) = (in_RDI->io_watcher).pending_queue[1];
    **(long **)(in_RSI + 0x28) = (long)(in_RSI + 0x20);
    (in_RDI->io_watcher).pending_queue[1] = in_RSI + 0x20;
    *(undefined8 *)(in_RSI + 0x38) = 0;
    *(undefined8 *)(in_RSI + 0x40) = in_RDX;
    *(undefined4 *)(in_RSI + 0x58) = 0;
    *(int **)(in_RSI + 0x48) = &in_RDI[4].io_watcher.fd;
    *(undefined8 *)(in_RSI + 0x50) = *(undefined8 *)&in_RDI[4].wfd;
    **(long **)(in_RSI + 0x50) = (long)(in_RSI + 0x48);
    *(uv__async_cb *)&in_RDI[4].wfd = in_RSI + 0x48;
    if (((*(uint *)(in_RSI + 0x30) & 0x4000) == 0) &&
       (*(uint *)(in_RSI + 0x30) = *(uint *)(in_RSI + 0x30) | 0x4000,
       (*(uint *)(in_RSI + 0x30) & 0x2000) != 0)) {
      *(int *)(*(long *)(in_RSI + 0x10) + 8) = *(int *)(*(long *)(in_RSI + 0x10) + 8) + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv_async_init(uv_loop_t* loop, uv_async_t* handle, uv_async_cb async_cb) {
  int err;

  err = uv__async_start(loop, &loop->async_watcher, uv__async_event);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*)handle, UV_ASYNC);
  handle->async_cb = async_cb;
  handle->pending = 0;

  QUEUE_INSERT_TAIL(&loop->async_handles, &handle->queue);
  uv__handle_start(handle);

  return 0;
}